

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDebugger.h
# Opt level: O3

void __thiscall moira::Debugger::Debugger(Debugger *this,Moira *ref)

{
  _Rb_tree_header *p_Var1;
  Guard *pGVar2;
  
  this->moira = ref;
  (this->breakpoints).super_Guards._vptr_Guards = (_func_int **)&PTR__Guards_0053d3c0;
  (this->breakpoints).super_Guards.capacity = 1;
  pGVar2 = (Guard *)operator_new__(0x10);
  pGVar2->addr = 0;
  pGVar2->enabled = true;
  pGVar2->ignore = 0;
  (this->breakpoints).super_Guards.guards = pGVar2;
  (this->breakpoints).super_Guards.count = 0;
  (this->breakpoints).super_Guards.hit.super__Optional_base<moira::Guard,_true,_true>._M_payload.
  super__Optional_payload_base<moira::Guard>._M_engaged = false;
  (this->breakpoints).super_Guards._vptr_Guards = (_func_int **)&PTR__Guards_0053d3f8;
  (this->breakpoints).moira = ref;
  (this->watchpoints).super_Guards._vptr_Guards = (_func_int **)&PTR__Guards_0053d3c0;
  (this->watchpoints).super_Guards.capacity = 1;
  pGVar2 = (Guard *)operator_new__(0x10);
  pGVar2->addr = 0;
  pGVar2->enabled = true;
  pGVar2->ignore = 0;
  (this->watchpoints).super_Guards.guards = pGVar2;
  (this->watchpoints).super_Guards.count = 0;
  (this->watchpoints).super_Guards.hit.super__Optional_base<moira::Guard,_true,_true>._M_payload.
  super__Optional_payload_base<moira::Guard>._M_engaged = false;
  (this->watchpoints).super_Guards._vptr_Guards = (_func_int **)&PTR__Guards_0053d438;
  (this->watchpoints).moira = ref;
  (this->catchpoints).super_Guards._vptr_Guards = (_func_int **)&PTR__Guards_0053d3c0;
  (this->catchpoints).super_Guards.capacity = 1;
  pGVar2 = (Guard *)operator_new__(0x10);
  pGVar2->addr = 0;
  pGVar2->enabled = true;
  pGVar2->ignore = 0;
  (this->catchpoints).super_Guards.guards = pGVar2;
  (this->catchpoints).super_Guards.count = 0;
  (this->catchpoints).super_Guards.hit.super__Optional_base<moira::Guard,_true,_true>._M_payload.
  super__Optional_payload_base<moira::Guard>._M_engaged = false;
  (this->catchpoints).super_Guards._vptr_Guards = (_func_int **)&PTR__Guards_0053d478;
  (this->catchpoints).moira = ref;
  p_Var1 = &(this->swTraps).traps._M_t._M_impl.super__Rb_tree_header;
  (this->swTraps).traps._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->swTraps).traps._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->swTraps).traps._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->swTraps).traps._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->swTraps).traps._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->softStop).super__Optional_base<long_long,_true,_true>._M_payload.
  super__Optional_payload_base<long_long>._M_engaged = false;
  this->logCnt = 0;
  return;
}

Assistant:

Debugger(Moira& ref) : moira(ref) { }